

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ReplaceDefaultMaterial(Discreet3DSImporter *this)

{
  ai_real *paVar1;
  float fVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  reference pcVar8;
  long lVar9;
  reference pMVar10;
  reference puVar11;
  Logger *pLVar12;
  aiColor3D local_350 [2];
  allocator local_331;
  string local_330;
  undefined1 local_310 [8];
  Material sMat;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  iterator a;
  __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
  local_40;
  iterator i_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  uint cnt;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  iterator it;
  string *s;
  uint i;
  uint idx;
  Discreet3DSImporter *this_local;
  
  s._4_4_ = 0xcdcdcdcd;
  for (s._0_4_ = 0;
      sVar6 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                        (&this->mScene->mMaterials), (uint)s < sVar6; s._0_4_ = (uint)s + 1) {
    pvVar7 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
             operator[](&this->mScene->mMaterials,(ulong)(uint)s);
    it._M_current = (char *)&pvVar7->mName;
    local_28._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      _Stack_30._M_current = (char *)std::__cxx11::string::end();
      bVar4 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
      if (!bVar4) break;
      pcVar8 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      iVar5 = tolower((int)*pcVar8);
      pcVar8 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      *pcVar8 = (char)iVar5;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_28);
    }
    lVar9 = std::__cxx11::string::find(it._M_current,0xbf90e4);
    if (lVar9 != -1) {
      pvVar7 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
               operator[](&this->mScene->mMaterials,(ulong)(uint)s);
      fVar2 = (pvVar7->mDiffuse).r;
      pvVar7 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
               operator[](&this->mScene->mMaterials,(ulong)(uint)s);
      paVar1 = &(pvVar7->mDiffuse).g;
      if ((fVar2 == *paVar1) && (!NAN(fVar2) && !NAN(*paVar1))) {
        pvVar7 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
                 operator[](&this->mScene->mMaterials,(ulong)(uint)s);
        fVar2 = (pvVar7->mDiffuse).r;
        pvVar7 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
                 operator[](&this->mScene->mMaterials,(ulong)(uint)s);
        paVar1 = &(pvVar7->mDiffuse).b;
        if ((fVar2 == *paVar1) && (!NAN(fVar2) && !NAN(*paVar1))) {
          std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::operator[]
                    (&this->mScene->mMaterials,(ulong)(uint)s);
          lVar9 = std::__cxx11::string::length();
          if (lVar9 == 0) {
            std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::operator[]
                      (&this->mScene->mMaterials,(ulong)(uint)s);
            lVar9 = std::__cxx11::string::length();
            if (lVar9 == 0) {
              std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
              operator[](&this->mScene->mMaterials,(ulong)(uint)s);
              lVar9 = std::__cxx11::string::length();
              if (lVar9 == 0) {
                std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
                operator[](&this->mScene->mMaterials,(ulong)(uint)s);
                lVar9 = std::__cxx11::string::length();
                if (lVar9 == 0) {
                  std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
                  operator[](&this->mScene->mMaterials,(ulong)(uint)s);
                  lVar9 = std::__cxx11::string::length();
                  if (lVar9 == 0) {
                    std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::
                    operator[](&this->mScene->mMaterials,(ulong)(uint)s);
                    lVar9 = std::__cxx11::string::length();
                    if (lVar9 == 0) {
                      s._4_4_ = (uint)s;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (s._4_4_ == 0xcdcdcdcd) {
    sVar6 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                      (&this->mScene->mMaterials);
    s._4_4_ = (uint)sVar6;
  }
  i_1._M_current._4_4_ = 0;
  local_40._M_current =
       (Mesh *)std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::begin
                         (&this->mScene->mMeshes);
  while( true ) {
    a._M_current = (uint *)std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::end
                                     (&this->mScene->mMeshes);
    bVar4 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                        *)&a);
    if (!bVar4) break;
    pMVar10 = __gnu_cxx::
              __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
              ::operator*(&local_40);
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&pMVar10->mFaceMaterials);
    while( true ) {
      pMVar10 = __gnu_cxx::
                __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                ::operator*(&local_40);
      sMat._688_8_ = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&pMVar10->mFaceMaterials);
      bVar4 = __gnu_cxx::operator!=
                        (&local_50,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&sMat.mTwoSided);
      if (!bVar4) break;
      puVar11 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&local_50);
      if (*puVar11 == 0xcdcdcdcd) {
        puVar11 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&local_50);
        *puVar11 = s._4_4_;
        i_1._M_current._4_4_ = i_1._M_current._4_4_ + 1;
      }
      else {
        puVar11 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&local_50);
        uVar3 = *puVar11;
        sVar6 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                          (&this->mScene->mMaterials);
        if (sVar6 <= uVar3) {
          puVar11 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&local_50);
          *puVar11 = s._4_4_;
          pLVar12 = DefaultLogger::get();
          Logger::warn(pLVar12,"Material index overflow in 3DS file. Using default material");
          i_1._M_current._4_4_ = i_1._M_current._4_4_ + 1;
        }
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_50);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
    ::operator++(&local_40);
  }
  if ((i_1._M_current._4_4_ != 0) &&
     (sVar6 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                        (&this->mScene->mMaterials), s._4_4_ == sVar6)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_330,"%%%DEFAULT",&local_331);
    D3DS::Material::Material((Material *)local_310,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    aiColor3D::aiColor3D(local_350,0.3,0.3,0.3);
    aiColor3D::operator=((aiColor3D *)((long)&sMat.mName.field_2 + 8),local_350);
    std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::push_back
              (&this->mScene->mMaterials,(value_type *)local_310);
    pLVar12 = DefaultLogger::get();
    Logger::info(pLVar12,"3DS: Generating default material");
    D3DS::Material::~Material((Material *)local_310);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ReplaceDefaultMaterial()
{
    // Try to find an existing material that matches the
    // typical default material setting:
    // - no textures
    // - diffuse color (in grey!)
    // NOTE: This is here to workaround the fact that some
    // exporters are writing a default material, too.
    unsigned int idx( NotSet );
    for (unsigned int i = 0; i < mScene->mMaterials.size();++i)
    {
        std::string &s = mScene->mMaterials[i].mName;
        for ( std::string::iterator it = s.begin(); it != s.end(); ++it ) {
            *it = static_cast< char >( ::tolower( *it ) );
        }

        if (std::string::npos == s.find("default"))continue;

        if (mScene->mMaterials[i].mDiffuse.r !=
            mScene->mMaterials[i].mDiffuse.g ||
            mScene->mMaterials[i].mDiffuse.r !=
            mScene->mMaterials[i].mDiffuse.b)continue;

        if (mScene->mMaterials[i].sTexDiffuse.mMapName.length()   != 0  ||
            mScene->mMaterials[i].sTexBump.mMapName.length()      != 0  ||
            mScene->mMaterials[i].sTexOpacity.mMapName.length()   != 0  ||
            mScene->mMaterials[i].sTexEmissive.mMapName.length()  != 0  ||
            mScene->mMaterials[i].sTexSpecular.mMapName.length()  != 0  ||
            mScene->mMaterials[i].sTexShininess.mMapName.length() != 0 )
        {
            continue;
        }
        idx = i;
    }
    if ( NotSet == idx ) {
        idx = ( unsigned int )mScene->mMaterials.size();
    }

    // now iterate through all meshes and through all faces and
    // find all faces that are using the default material
    unsigned int cnt = 0;
    for (std::vector<D3DS::Mesh>::iterator
        i =  mScene->mMeshes.begin();
        i != mScene->mMeshes.end();++i)
    {
        for (std::vector<unsigned int>::iterator
            a =  (*i).mFaceMaterials.begin();
            a != (*i).mFaceMaterials.end();++a)
        {
            // NOTE: The additional check seems to be necessary,
            // some exporters seem to generate invalid data here
            if (0xcdcdcdcd == (*a))
            {
                (*a) = idx;
                ++cnt;
            }
            else if ( (*a) >= mScene->mMaterials.size())
            {
                (*a) = idx;
                ASSIMP_LOG_WARN("Material index overflow in 3DS file. Using default material");
                ++cnt;
            }
        }
    }
    if (cnt && idx == mScene->mMaterials.size())
    {
        // We need to create our own default material
        D3DS::Material sMat("%%%DEFAULT");
        sMat.mDiffuse = aiColor3D(0.3f,0.3f,0.3f);
        mScene->mMaterials.push_back(sMat);

        ASSIMP_LOG_INFO("3DS: Generating default material");
    }
}